

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall
InterpGCTest_Collect_GlobalCycle_Test::TestBody(InterpGCTest_Collect_GlobalCycle_Test *this)

{
  bool bVar1;
  Global *pGVar2;
  Ref RVar3;
  Global *this_00;
  char *pcVar4;
  undefined8 in_R9;
  Value VVar5;
  Value value;
  AssertHelper local_128;
  Message local_120;
  Index local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_1;
  Message local_f8;
  unsigned_long local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  Index after_new;
  GlobalType *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [32];
  Ptr g2;
  GlobalType *local_70;
  _Bit_type *local_68;
  undefined1 local_60 [32];
  Ptr g1;
  undefined1 local_28 [8];
  GlobalType gt;
  InterpGCTest_Collect_GlobalCycle_Test *this_local;
  
  gt._16_8_ = this;
  wabt::Type::Type((Type *)((long)&g1.root_index_ + 4),Anyref);
  wabt::interp::GlobalType::GlobalType((GlobalType *)local_28,g1.root_index_._4_4_,Var);
  wabt::interp::GlobalType::GlobalType((GlobalType *)local_60,(GlobalType *)local_28);
  g2.root_index_ = wabt::interp::Ref::Null.index;
  VVar5 = wabt::interp::Value::Make(wabt::interp::Ref::Null);
  local_70 = (GlobalType *)VVar5.i64_;
  local_68 = VVar5._8_8_;
  VVar5._8_8_ = in_R9;
  VVar5.i64_ = (u64)local_68;
  wabt::interp::Global::New
            ((Ptr *)(local_60 + 0x18),(Global *)&(this->super_InterpGCTest).super_InterpTest.store_,
             (Store *)local_60,local_70,VVar5);
  wabt::interp::GlobalType::~GlobalType((GlobalType *)local_60);
  wabt::interp::GlobalType::GlobalType((GlobalType *)local_a8,(GlobalType *)local_28);
  pGVar2 = wabt::interp::RefPtr<wabt::interp::Global>::operator->
                     ((RefPtr<wabt::interp::Global> *)(local_60 + 0x18));
  RVar3 = wabt::interp::Object::self((Object *)pGVar2);
  VVar5 = wabt::interp::Value::Make(RVar3);
  local_b8 = (GlobalType *)VVar5.i64_;
  local_b0 = VVar5._8_8_;
  value._8_8_ = in_R9;
  value.i64_ = local_b0;
  wabt::interp::Global::New
            ((Ptr *)(local_a8 + 0x18),(Global *)&(this->super_InterpGCTest).super_InterpTest.store_,
             (Store *)local_a8,local_b8,value);
  wabt::interp::GlobalType::~GlobalType((GlobalType *)local_a8);
  pGVar2 = wabt::interp::RefPtr<wabt::interp::Global>::operator->
                     ((RefPtr<wabt::interp::Global> *)(local_60 + 0x18));
  this_00 = wabt::interp::RefPtr<wabt::interp::Global>::operator->
                      ((RefPtr<wabt::interp::Global> *)(local_a8 + 0x18));
  RVar3 = wabt::interp::Object::self((Object *)this_00);
  wabt::interp::Global::Set(pGVar2,&(this->super_InterpGCTest).super_InterpTest.store_,RVar3);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_f0 = (this->super_InterpGCTest).before_new + 2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_e8,"before_new + 2","after_new",&local_f0,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x245,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  wabt::interp::RefPtr<wabt::interp::Global>::reset
            ((RefPtr<wabt::interp::Global> *)(local_60 + 0x18));
  wabt::interp::Store::Collect(&(this->super_InterpGCTest).super_InterpTest.store_);
  local_118 = wabt::interp::Store::object_count(&(this->super_InterpGCTest).super_InterpTest.store_)
  ;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_110,"after_new","store_.object_count()",
             (unsigned_long *)&gtest_ar.message_,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-interp.cc"
               ,0x24a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  wabt::interp::RefPtr<wabt::interp::Global>::reset
            ((RefPtr<wabt::interp::Global> *)(local_a8 + 0x18));
  wabt::interp::RefPtr<wabt::interp::Global>::~RefPtr
            ((RefPtr<wabt::interp::Global> *)(local_a8 + 0x18));
  wabt::interp::RefPtr<wabt::interp::Global>::~RefPtr
            ((RefPtr<wabt::interp::Global> *)(local_60 + 0x18));
  wabt::interp::GlobalType::~GlobalType((GlobalType *)local_28);
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_GlobalCycle) {
  auto gt = GlobalType{ValueType::Anyref, Mutability::Var};
  auto g1 = Global::New(store_, gt, Value::Make(Ref::Null));
  auto g2 = Global::New(store_, gt, Value::Make(g1->self()));
  g1->Set(store_, g2->self());

  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 2, after_new);

  // Remove g1 root, but it's kept alive by g2.
  g1.reset();
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());

  // Remove g2 root, now both should be removed.
  g2.reset();
}